

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFCodewordDecoder.cpp
# Opt level: O0

int ZXing::Pdf417::CodewordDecoder::GetDecodedValue(array<int,_8UL> *moduleBitCount)

{
  ModuleBitCountType *unaff_retaddr;
  int decodedValue;
  ModuleBitCountType *in_stack_00000040;
  ModuleBitCountType *in_stack_ffffffffffffffd0;
  undefined4 local_4;
  
  SampleBitCounts(unaff_retaddr);
  local_4 = GetDecodedCodewordValue(in_stack_ffffffffffffffd0);
  if (local_4 == -1) {
    local_4 = GetClosestDecodedValue(in_stack_00000040);
  }
  return local_4;
}

Assistant:

int
CodewordDecoder::GetDecodedValue(const std::array<int, BARS_IN_MODULE>& moduleBitCount)
{
	int decodedValue = GetDecodedCodewordValue(SampleBitCounts(moduleBitCount));
	if (decodedValue != -1) {
		return decodedValue;
	}
	return GetClosestDecodedValue(moduleBitCount);
}